

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFFPrimitiveReader.cpp
# Opt level: O0

EStatusCode __thiscall
CFFPrimitiveReader::ReadOffset(CFFPrimitiveReader *this,unsigned_long *outValue)

{
  ushort local_20;
  byte local_1d;
  EStatusCode local_1c;
  unsigned_short shortBuffer;
  Byte byteBuffer;
  EStatusCode status;
  unsigned_long *outValue_local;
  CFFPrimitiveReader *this_local;
  
  local_1c = eFailure;
  _shortBuffer = outValue;
  outValue_local = (unsigned_long *)this;
  switch(this->mCurrentOffsize) {
  case '\x01':
    local_1c = ReadCard8(this,&local_1d);
    if (local_1c == eSuccess) {
      *_shortBuffer = (ulong)local_1d;
    }
    break;
  case '\x02':
    local_1c = ReadCard16(this,&local_20);
    if (local_1c == eSuccess) {
      *_shortBuffer = (ulong)local_20;
    }
    break;
  case '\x03':
    local_1c = Read3ByteUnsigned(this,outValue);
    break;
  case '\x04':
    local_1c = Read4ByteUnsigned(this,outValue);
  }
  return local_1c;
}

Assistant:

EStatusCode CFFPrimitiveReader::ReadOffset(unsigned long& outValue)
{
	EStatusCode status = PDFHummus::eFailure;

	switch(mCurrentOffsize)
	{
		case 1:
			Byte byteBuffer;
			status = ReadCard8(byteBuffer);
			if(PDFHummus::eSuccess == status)
				outValue = byteBuffer;
			break;
		case 2:
			unsigned short shortBuffer;
			status = ReadCard16(shortBuffer);
			if(PDFHummus::eSuccess == status)
				outValue = shortBuffer;
			break;
		case 3:
			status = Read3ByteUnsigned(outValue);
			break;
		case 4:
			status = Read4ByteUnsigned(outValue);
			break;

	}

	return status;
}